

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O1

ssize_t __thiscall crnlib::buffer_stream::write(buffer_stream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  size_t __n_00;
  undefined4 in_register_00000034;
  
  __n_00 = 0;
  if (((((this->super_data_stream).field_0x1a & 1) != 0) && ((uint)__buf != 0)) &&
     (((this->super_data_stream).m_attribs & 2) != 0)) {
    uVar1 = this->m_ofs;
    uVar2 = this->m_size - uVar1;
    __n_00 = (size_t)uVar2;
    if ((uint)__buf < uVar2) {
      __n_00 = (ulong)__buf & 0xffffffff;
    }
    if (this->m_size != uVar1) {
      memcpy(this->m_pBuf + uVar1,(void *)CONCAT44(in_register_00000034,__fd),__n_00);
    }
    this->m_ofs = this->m_ofs + (int)__n_00;
  }
  return __n_00;
}

Assistant:

virtual uint write(const void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if ((!m_opened) || (!is_writable()) || (!len))
            {
                return 0;
            }

            CRNLIB_ASSERT(m_ofs <= m_size);

            uint bytes_left = m_size - m_ofs;

            len = math::minimum<uint>(len, bytes_left);

            if (len)
            {
                memcpy(&m_pBuf[m_ofs], pBuf, len);
            }

            m_ofs += len;

            return len;
        }